

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VANAnalyzer.cpp
# Opt level: O0

void __thiscall
VanAnalyzer::AddFrame
          (VanAnalyzer *this,U64 startingPoint,U64 endingPoint,U32 data,U32 type,U32 indexOfData)

{
  element_type *peVar1;
  FrameV2 local_70 [8];
  FrameV2 frame_v2;
  U64 local_58;
  Frame frame;
  U32 indexOfData_local;
  U32 type_local;
  U32 data_local;
  U64 endingPoint_local;
  U64 startingPoint_local;
  VanAnalyzer *this_local;
  
  Frame::Frame((Frame *)&local_58);
  local_58 = startingPoint;
  _frame = endingPoint;
  peVar1 = std::auto_ptr<VanAnalyzerResults>::operator->(&this->mResults);
  AnalyzerResults::AddFrame((Frame *)peVar1);
  FrameV2::FrameV2(local_70);
  if (type == 1) {
    FrameV2::AddInteger((char *)local_70,0x10a031);
  }
  else if (type == 2) {
    FrameV2::AddByte((char *)local_70,'<');
    FrameV2::AddByte((char *)local_70,'D');
  }
  else {
    FrameV2::AddByte((char *)local_70,'D');
  }
  peVar1 = std::auto_ptr<VanAnalyzerResults>::operator->(&this->mResults);
  AnalyzerResults::AddFrameV2
            ((FrameV2 *)peVar1,(char *)local_70,(ulonglong)this->VanFrameTypeForDisplay[type],
             local_58);
  std::auto_ptr<VanAnalyzerResults>::operator->(&this->mResults);
  AnalyzerResults::CommitResults();
  Analyzer::ReportProgress((ulonglong)this);
  FrameV2::~FrameV2(local_70);
  Frame::~Frame((Frame *)&local_58);
  return;
}

Assistant:

void VanAnalyzer::AddFrame( const U64 startingPoint, const U64 endingPoint, const U32 data, const U32 type, const U32 indexOfData )
{
    Frame frame;
    frame.mData1 = data;
    frame.mData2 = indexOfData;
    frame.mFlags = 0;
    frame.mType = type;
    frame.mStartingSampleInclusive = startingPoint;
    frame.mEndingSampleInclusive = endingPoint;

    mResults->AddFrame( frame );

    FrameV2 frame_v2;

    // you can add any number of key value pairs. Each will get it's own column in the data table.
    if( type == IdentifierField )
    {
        frame_v2.AddInteger( "Identifier", frame.mData1 );
    }
    else if( type == CommandField )
    {
        frame_v2.AddByte( "Command", frame.mData1 );
        frame_v2.AddByte( "Data", frame.mData1 );
    }
    else
    {
        frame_v2.AddByte( "Data", frame.mData1 );
    }

    // The second parameter is the frame "type". Any string is allowed.
    mResults->AddFrameV2( frame_v2, VanFrameTypeForDisplay[ type ], frame.mStartingSampleInclusive, frame.mEndingSampleInclusive );

    mResults->CommitResults();
    ReportProgress( frame.mEndingSampleInclusive );
}